

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::OuterProduct<2,_4>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<2,_4> *this,EvalContext *ctx,IArgs *iargs)

{
  Vector<tcu::Interval,_4> *pVVar1;
  Mul *pMVar2;
  IArgs *pIVar3;
  undefined8 uVar4;
  long lVar5;
  bool *pbVar6;
  undefined1 local_86;
  undefined1 local_85;
  uint local_84;
  IRet *local_80;
  Interval *local_78;
  long local_70;
  bool *local_68;
  bool *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  undefined8 local_38;
  
  pIVar3 = iargs;
  local_80 = __return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix(__return_storage_ptr__);
  uVar4 = CONCAT71((int7)((ulong)pIVar3 >> 8),1);
  local_70 = 0;
  do {
    local_84 = (uint)uVar4;
    local_78 = (local_80->m_data).m_data[0].m_data + local_70;
    local_70 = local_70 * 0x18;
    lVar5 = 0;
    do {
      pbVar6 = &iargs->a->m_data[0].m_hasNaN + local_70;
      pVVar1 = iargs->b;
      pMVar2 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Mul>();
      local_50 = &local_86;
      local_68 = pbVar6;
      local_60 = &pVVar1->m_data[0].m_hasNaN + lVar5;
      local_58 = &local_85;
      (**(code **)((long)*pMVar2 + 0x40))(&local_48,pMVar2,ctx,&local_68);
      *(undefined8 *)((long)&local_78->m_hi + lVar5 * 2) = local_38;
      *(undefined8 *)(&local_78->m_hasNaN + lVar5 * 2) = local_48;
      *(double *)(&local_78->m_hasNaN + lVar5 * 2 + 8) = dStack_40;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x60);
    local_70 = 1;
    uVar4 = 0;
  } while ((local_84 & 1) != 0);
  return local_80;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}